

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O3

QWidget * QApplication::topLevelAt(QPoint *pos)

{
  long lVar1;
  
  lVar1 = QGuiApplication::topLevelAt(pos);
  if ((((lVar1 != 0) &&
       (lVar1 = QMetaObject::cast((QObject *)&QWidgetWindow::staticMetaObject), lVar1 != 0)) &&
      (*(long *)(lVar1 + 0x28) != 0)) && (*(int *)(*(long *)(lVar1 + 0x28) + 4) != 0)) {
    return *(QWidget **)(lVar1 + 0x30);
  }
  return (QWidget *)0x0;
}

Assistant:

QWidget *QApplication::topLevelAt(const QPoint &pos)
{
    if (const QWindow *window = QGuiApplication::topLevelAt(pos)) {
        if (const QWidgetWindow *widgetWindow = qobject_cast<const QWidgetWindow *>(window))
            return widgetWindow->widget();
    }
    return nullptr;
}